

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.c
# Opt level: O3

Qiniu_HMAC * Qiniu_HMAC_New(Qiniu_Digest_Type digest_type,uchar *key,int key_len)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  char *pcVar2;
  EVP_MD *type;
  EVP_PKEY *pkey;
  Qiniu_HMAC *pQVar3;
  char *name;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx != (EVP_MD_CTX *)0x0) {
    iVar1 = EVP_MD_CTX_reset(ctx);
    if (iVar1 != 0) {
      pcVar2 = (char *)0x0;
      if (digest_type == QINIU_DIGEST_TYPE_MD5) {
        pcVar2 = "md5";
      }
      name = "sha1";
      if (digest_type != QINIU_DIGEST_TYPE_SHA1) {
        name = pcVar2;
      }
      type = EVP_get_digestbyname(name);
      if ((type != (EVP_MD *)0x0) &&
         (pkey = EVP_PKEY_new_mac_key(0x357,(ENGINE *)0x0,key,key_len), pkey != (EVP_PKEY *)0x0)) {
        iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
        if ((iVar1 != 0) && (pQVar3 = (Qiniu_HMAC *)malloc(0x10), pQVar3 != (Qiniu_HMAC *)0x0)) {
          pQVar3->md_ctx = (EVP_MD_CTX *)ctx;
          pQVar3->pkey = (EVP_PKEY *)pkey;
          return pQVar3;
        }
        EVP_MD_CTX_free(ctx);
        EVP_PKEY_free(pkey);
        return (Qiniu_HMAC *)0x0;
      }
    }
    EVP_MD_CTX_free(ctx);
  }
  return (Qiniu_HMAC *)0x0;
}

Assistant:

Qiniu_HMAC *Qiniu_HMAC_New(Qiniu_Digest_Type digest_type, const unsigned char *key, int key_len)
{
	EVP_MD_CTX *md_ctx = EVP_MD_CTX_create();
	if (md_ctx == NULL) {
		return NULL;
	}
	if (EVP_MD_CTX_init(md_ctx) == 0) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}


	const EVP_MD* md = EVP_get_digestbyname(Qiniu_Digest_Type_To_Name(digest_type));
	if (md == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	EVP_PKEY *pkey = EVP_PKEY_new_mac_key(EVP_PKEY_HMAC, NULL, key, key_len);
	if (pkey == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	if (EVP_DigestSignInit(md_ctx, NULL, md, NULL, pkey) == 0) {
		EVP_MD_CTX_free(md_ctx);
		EVP_PKEY_free(pkey);
		return NULL;
	}
	Qiniu_HMAC *hmac = malloc(sizeof(Qiniu_HMAC));
	if (hmac == NULL) {
		EVP_MD_CTX_free(md_ctx);
		EVP_PKEY_free(pkey);
		return NULL;
	}
	hmac->md_ctx = md_ctx;
	hmac->pkey = pkey;
	return hmac;
}